

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O0

bool __thiscall
Assimp::ASEImporter::CanRead(ASEImporter *this,string *pFile,IOSystem *pIOHandler,bool cs)

{
  bool bVar1;
  long lVar2;
  char *local_68;
  char *tokens [1];
  undefined1 local_50 [8];
  string extension;
  bool cs_local;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  ASEImporter *this_local;
  
  extension.field_2._M_local_buf[0xf] = cs;
  BaseImporter::GetExtension((string *)local_50,pFile);
  bVar1 = std::operator==((string *)local_50,"ase");
  if (!bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,"ask");
    if (!bVar1) {
      lVar2 = std::__cxx11::string::length();
      if (((lVar2 == 0) || ((extension.field_2._M_local_buf[0xf] & 1U) != 0)) &&
         (pIOHandler != (IOSystem *)0x0)) {
        local_68 = "*3dsmax_asciiexport";
        this_local._7_1_ =
             BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,&local_68,1,200,false,false);
      }
      else {
        this_local._7_1_ = false;
      }
      goto LAB_0061c005;
    }
  }
  this_local._7_1_ = true;
LAB_0061c005:
  tokens[0]._0_4_ = 1;
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool ASEImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool cs) const {
    // check file extension
    const std::string extension = GetExtension(pFile);

    if (extension == "ase" || extension == "ask") {
        return true;
    }

    if ((!extension.length() || cs) && pIOHandler) {
        const char* tokens[] = {"*3dsmax_asciiexport"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1);
    }
    return false;
}